

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_packsshb_mips(uint64_t fs,uint64_t ft)

{
  uint64_t uVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  long lVar5;
  
  bVar3 = 0;
  uVar1 = 0;
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    sVar4 = (short)(fs >> ((byte)lVar5 & 0x3f));
    if (0x7e < sVar4) {
      sVar4 = 0x7f;
    }
    bVar2 = (byte)sVar4;
    if (sVar4 < -0x7f) {
      bVar2 = 0x80;
    }
    uVar1 = uVar1 | (ulong)bVar2 << (bVar3 & 0x3f);
    bVar3 = bVar3 + 8;
  }
  bVar3 = 0;
  for (lVar5 = 0x20; lVar5 != 0x40; lVar5 = lVar5 + 8) {
    sVar4 = (short)(ft >> (bVar3 & 0x3f));
    if (0x7e < sVar4) {
      sVar4 = 0x7f;
    }
    bVar2 = (byte)sVar4;
    if (sVar4 < -0x7f) {
      bVar2 = 0x80;
    }
    uVar1 = uVar1 | (ulong)bVar2 << ((byte)lVar5 & 0x3f);
    bVar3 = bVar3 + 0x10;
  }
  return uVar1;
}

Assistant:

uint64_t helper_packsshb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}